

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

Request<capnp::AnyPointer,_capnp::AnyPointer> * __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcClient::newCallNoIntercept
          (Request<capnp::AnyPointer,_capnp::AnyPointer> *__return_storage_ptr__,RpcClient *this,
          uint64_t interfaceId,uint16_t methodId,Maybe<capnp::MessageSize> *sizeHint,CallHints hints
          )

{
  StructDataBitCount *this_00;
  Builder builder;
  bool bVar1;
  RpcConnectionState *pRVar2;
  Exception *t;
  RefOrVoid<capnp::_::RpcSystemBase::RpcConnectionState> params;
  Connected *pCVar3;
  RefOrVoid<capnp::_::VatNetworkBase::Connection> params_1;
  RpcRequest *pRVar4;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest,_std::nullptr_t> *other;
  Own<capnp::RequestHook,_std::nullptr_t> local_278;
  SegmentBuilder *local_268;
  SegmentBuilder *pSStack_260;
  WirePointer *local_258;
  undefined1 auStack_250 [8];
  Builder root;
  Builder callBuilder;
  undefined1 local_200 [8];
  Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest,_std::nullptr_t> request;
  Maybe<capnp::MessageSize> local_1e0;
  Exception local_1c8;
  undefined8 local_38;
  Maybe<capnp::MessageSize> *sizeHint_local;
  undefined8 uStack_28;
  uint16_t methodId_local;
  uint64_t interfaceId_local;
  RpcClient *this_local;
  undefined8 uStack_10;
  CallHints hints_local;
  
  local_38 = sizeHint;
  sizeHint_local._6_2_ = methodId;
  uStack_28 = interfaceId;
  interfaceId_local = (uint64_t)this;
  this_local._6_2_ = hints;
  uStack_10 = __return_storage_ptr__;
  pRVar2 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator->
                     (&this->connectionState);
  bVar1 = kj::OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,_kj::Exception>::
          is<capnp::_::RpcSystemBase::RpcConnectionState::Connected>(&pRVar2->connection);
  if (bVar1) {
    params = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator*
                       (&this->connectionState);
    pRVar2 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator->
                       (&this->connectionState);
    pCVar3 = kj::OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,_kj::Exception>::
             get<capnp::_::RpcSystemBase::RpcConnectionState::Connected>(&pRVar2->connection);
    params_1 = kj::Own<capnp::_::VatNetworkBase::Connection,_std::nullptr_t>::operator*
                         (&pCVar3->connection);
    this_00 = &callBuilder._builder.dataSize;
    kj::addRef<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient>((kj *)this_00,this);
    kj::
    heap<capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest,capnp::_::RpcSystemBase::RpcConnectionState&,capnp::_::VatNetworkBase::Connection&,kj::Maybe<capnp::MessageSize>&,kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,decltype(nullptr)>>
              ((kj *)local_200,params,params_1,sizeHint,
               (Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t> *)
               this_00);
    kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t>::~Own
              ((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t> *)
               &callBuilder._builder.dataSize);
    pRVar4 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest,_std::nullptr_t>::
             operator->((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest,_std::nullptr_t>
                         *)local_200);
    RpcRequest::getCall((Builder *)&root.builder.pointer,pRVar4);
    rpc::Call::Builder::setInterfaceId((Builder *)&root.builder.pointer,uStack_28);
    rpc::Call::Builder::setMethodId((Builder *)&root.builder.pointer,sizeHint_local._6_2_);
    rpc::Call::Builder::setNoPromisePipelining
              ((Builder *)&root.builder.pointer,(bool)(this_local._6_1_ & 1));
    rpc::Call::Builder::setOnlyPromisePipeline
              ((Builder *)&root.builder.pointer,(bool)(this_local._7_1_ & 1));
    pRVar4 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest,_std::nullptr_t>::
             operator->((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest,_std::nullptr_t>
                         *)local_200);
    RpcRequest::getRoot((Builder *)auStack_250,pRVar4);
    local_258 = (WirePointer *)root.builder.capTable;
    local_268 = (SegmentBuilder *)auStack_250;
    pSStack_260 = root.builder.segment;
    other = kj::
            mv<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest,decltype(nullptr)>>
                      ((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest,_std::nullptr_t>
                        *)local_200);
    kj::Own<capnp::RequestHook,decltype(nullptr)>::
    Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest,void>
              ((Own<capnp::RequestHook,decltype(nullptr)> *)&local_278,other);
    builder.builder.capTable = (CapTableBuilder *)pSStack_260;
    builder.builder.segment = local_268;
    builder.builder.pointer = local_258;
    Request<capnp::AnyPointer,_capnp::AnyPointer>::Request
              (__return_storage_ptr__,builder,&local_278);
    kj::Own<capnp::RequestHook,_std::nullptr_t>::~Own(&local_278);
    kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest,_std::nullptr_t>::~Own
              ((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest,_std::nullptr_t> *)
               local_200);
  }
  else {
    pRVar2 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator->
                       (&this->connectionState);
    t = kj::OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,_kj::Exception>::
        get<kj::Exception>(&pRVar2->connection);
    kj::cp<kj::Exception>(&local_1c8,t);
    kj::Maybe<capnp::MessageSize>::Maybe(&local_1e0,sizeHint);
    newBrokenRequest(__return_storage_ptr__,&local_1c8,&local_1e0);
    kj::Maybe<capnp::MessageSize>::~Maybe(&local_1e0);
    kj::Exception::~Exception(&local_1c8);
  }
  return __return_storage_ptr__;
}

Assistant:

Request<AnyPointer, AnyPointer> newCallNoIntercept(
        uint64_t interfaceId, uint16_t methodId, kj::Maybe<MessageSize> sizeHint,
        CallHints hints) {
      if (!connectionState->connection.is<Connected>()) {
        return newBrokenRequest(kj::cp(connectionState->connection.get<Disconnected>()), sizeHint);
      }

      auto request = kj::heap<RpcRequest>(
          *connectionState, *connectionState->connection.get<Connected>().connection,
          sizeHint, kj::addRef(*this));
      auto callBuilder = request->getCall();

      callBuilder.setInterfaceId(interfaceId);
      callBuilder.setMethodId(methodId);
      callBuilder.setNoPromisePipelining(hints.noPromisePipelining);
      callBuilder.setOnlyPromisePipeline(hints.onlyPromisePipeline);

      auto root = request->getRoot();
      return Request<AnyPointer, AnyPointer>(root, kj::mv(request));
    }